

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomCommunicationParameters.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::IntercomCommunicationParameters::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IntercomCommunicationParameters *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Intercom Communications Parameter",0x21);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\nType:     ",0xb);
  ENUMS::GetEnumAsStringAdditionalIntrCommParamType_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui16Type,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nLength:   ",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  (*this->m_pRecord->_vptr_DataTypeBase[2])(&local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_1e0,local_1d8);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString IntercomCommunicationParameters::GetAsString() const
{
    KStringStream ss;

    ss << "Intercom Communications Parameter"
       << "\nType:     " << GetEnumAsStringAdditionalIntrCommParamType( m_ui16Type )
       << "\nLength:   " << m_ui16Length
       << m_pRecord->GetAsString();

    return ss.str();
}